

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::FenceVkImpl::~FenceVkImpl(FenceVkImpl *this)

{
  _Elt_pointer pSVar1;
  _Elt_pointer Args_1;
  size_type sVar2;
  char **in_R9;
  string msg;
  char *local_28;
  size_type local_20;
  
  pSVar1 = (this->m_SyncPoints).
           super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  Args_1 = (this->m_SyncPoints).
           super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if ((this->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
    if (Args_1 != pSVar1) {
      local_20 = std::
                 deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                 ::size(&this->m_SyncPoints);
      sVar2 = std::
              deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
              ::size(&this->m_SyncPoints);
      local_28 = "fence.";
      if (1 < sVar2) {
        local_28 = "fences.";
      }
      FormatString<char[42],unsigned_long,char[17],char_const*>
                (&msg,(Diligent *)"FenceVkImpl::~FenceVkImpl(): waiting for ",
                 (char (*) [42])&local_20,(unsigned_long *)" pending Vulkan ",
                 (char (*) [17])&local_28,in_R9);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
      Wait(this,0xffffffffffffffff);
    }
  }
  else {
    if (Args_1 != pSVar1) {
      FormatString<char[26],char[21]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_SyncPoints.empty()"
                 ,(char (*) [21])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"~FenceVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0x53);
      std::__cxx11::string::~string((string *)&msg);
    }
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)(this->super_FenceBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                  .m_pDevice,&this->m_TimelineSemaphore,0xffffffffffffffff);
  }
  if (0x10 < this->m_MaxSyncPoints) {
    FormatString<char[152]>
              (&msg,(char (*) [152])
                    "Max queue size of pending fences is too big. This may indicate that none of the GetCompletedValue(), Wait() or ExtractSignalSemaphore() have been used."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  std::
  deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
  ::~deque(&this->m_SyncPoints);
  VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>::
  ~VulkanObjectWrapper(&this->m_TimelineSemaphore);
  DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>::
  ~DeviceObjectBase((DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                     *)this);
  return;
}

Assistant:

FenceVkImpl::~FenceVkImpl()
{
    if (IsTimelineSemaphore())
    {
        VERIFY_EXPR(m_SyncPoints.empty());
        m_pDevice->SafeReleaseDeviceObject(std::move(m_TimelineSemaphore), ~0ull);
    }
    else if (!m_SyncPoints.empty())
    {
        LOG_INFO_MESSAGE("FenceVkImpl::~FenceVkImpl(): waiting for ", m_SyncPoints.size(), " pending Vulkan ",
                         (m_SyncPoints.size() > 1 ? "fences." : "fence."));
        // Vulkan spec states that all queue submission commands that refer to
        // a fence must have completed execution before the fence is destroyed.
        // (https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-vkDestroyFence-fence-01120)
        Wait(UINT64_MAX);
    }

#ifdef DILIGENT_DEVELOPMENT
    if (m_MaxSyncPoints > RequiredArraySize * 2)
        LOG_WARNING_MESSAGE("Max queue size of pending fences is too big. This may indicate that none of the GetCompletedValue(), Wait() or ExtractSignalSemaphore() have been used.");
#endif
}